

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O2

bool __thiscall S2Cell::UEdgeIsClosest(S2Cell *this,S2Point *p,int v_end)

{
  bool bVar1;
  double dVar2;
  S2Point dir1;
  S2Point dir0;
  D local_60;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  D local_20;
  
  local_48 = (this->uv_).bounds_[0].bounds_.c_[0];
  uStack_40 = 0;
  local_38 = (this->uv_).bounds_[0].bounds_.c_[1];
  uStack_30 = 0;
  local_60.c_[1] =
       util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                 ((BasicVector<Vector2,_double,_2UL> *)((this->uv_).bounds_ + 1),v_end);
  local_60.c_[0] = local_60.c_[1] * local_60.c_[1] + 1.0;
  local_20.c_[2] = -local_48;
  local_20.c_[1] = local_60.c_[1] * local_20.c_[2];
  local_60.c_[2] = -local_38;
  local_60.c_[1] = local_60.c_[1] * local_60.c_[2];
  local_20.c_[0] = local_60.c_[0];
  dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                    ((BasicVector<Vector3,_double,_3UL> *)p,&local_20);
  if (dVar2 <= 0.0) {
    bVar1 = false;
  }
  else {
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                      ((BasicVector<Vector3,_double,_3UL> *)p,&local_60);
    bVar1 = dVar2 < 0.0;
  }
  return bVar1;
}

Assistant:

bool S2Cell::UEdgeIsClosest(const S2Point& p, int v_end) const {
  double u0 = uv_[0][0], u1 = uv_[0][1], v = uv_[1][v_end];
  // These are the normals to the planes that are perpendicular to the edge
  // and pass through one of its two endpoints.
  S2Point dir0(v * v + 1, -u0 * v, -u0);
  S2Point dir1(v * v + 1, -u1 * v, -u1);
  return p.DotProd(dir0) > 0 && p.DotProd(dir1) < 0;
}